

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O1

int __thiscall bhf::ads::SymbolAccess::Read(SymbolAccess *this,string *name,ostream *os)

{
  undefined4 uVar1;
  undefined4 uVar2;
  const_iterator cVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  uint32_t bytesRead;
  SymbolEntry entry;
  stringstream stream;
  SymbolEntryMap entries;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  uint32_t local_28c;
  string local_288;
  string local_268;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  char *local_228;
  long local_220;
  char local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  allocator_type local_1e8 [16];
  long local_1d8 [3];
  uint auStack_1c0 [22];
  ios_base local_168 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  local_60;
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&local_60,this);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          ::find(&local_60,name);
  if ((_Rb_tree_header *)cVar3._M_node == &local_60._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Read",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"(): symbol \'",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' not found\n",0xc);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_268._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_268._M_dataplus._M_p) !=
        &local_268.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_268._M_dataplus._M_p._4_4_,
                               (_Rb_tree_color)local_268._M_dataplus._M_p));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
    iVar6 = 0x710;
    goto LAB_001254af;
  }
  local_268._M_dataplus._M_p._0_4_ = cVar3._M_node[2]._M_color;
  local_268._M_dataplus._M_p._4_4_ = *(uint32_t *)&cVar3._M_node[2].field_0x4;
  local_268._M_string_length._0_4_ = *(uint32_t *)&cVar3._M_node[2]._M_parent;
  uVar1 = *(undefined4 *)((long)&cVar3._M_node[2]._M_parent + 4);
  uVar2 = *(undefined4 *)((long)&cVar3._M_node[2]._M_left + 2);
  local_268.field_2._6_4_ = *(undefined4 *)((long)&cVar3._M_node[2]._M_left + 6);
  local_268.field_2._10_4_ = *(undefined4 *)((long)&cVar3._M_node[2]._M_right + 2);
  local_268.field_2._M_allocated_capacity._0_2_ =
       (undefined2)((uint)*(undefined4 *)((long)&cVar3._M_node[2]._M_parent + 6) >> 0x10);
  local_268.field_2._M_allocated_capacity._2_2_ = (undefined2)uVar2;
  local_268.field_2._M_allocated_capacity._4_2_ = (undefined2)((uint)uVar2 >> 0x10);
  local_268._M_string_length._4_2_ = (undefined2)uVar1;
  local_268._M_string_length._6_2_ = (undefined2)((uint)uVar1 >> 0x10);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,*(long *)(cVar3._M_node + 3),
             (long)&(cVar3._M_node[3]._M_parent)->_M_color + *(long *)(cVar3._M_node + 3));
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,*(long *)(cVar3._M_node + 4),
             (long)&(cVar3._M_node[4]._M_parent)->_M_color + *(long *)(cVar3._M_node + 4));
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,*(long *)(cVar3._M_node + 5),
             (long)&(cVar3._M_node[5]._M_parent)->_M_color + *(long *)(cVar3._M_node + 5));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2a8,
             (ulong)CONCAT22(local_268._M_string_length._6_2_,local_268._M_string_length._4_2_),
             local_1e8);
  local_28c = 0;
  uVar4 = AdsDevice::ReadReqEx2
                    (&this->device,local_268._M_dataplus._M_p._4_4_,
                     (uint32_t)local_268._M_string_length,
                     (long)local_2a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_2a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_28c);
  if (uVar4 == 0) {
    switch(CONCAT22(local_268.field_2._M_allocated_capacity._2_2_,
                    local_268.field_2._M_allocated_capacity._0_2_)) {
    case 2:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (os,*(short *)local_2a8.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 3:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (os,(int)*(float *)local_2a8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 4:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::ostream::_M_insert<double>
                         ((double)*(float *)local_2a8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 5:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::ostream::_M_insert<double>
                         (*(double *)
                           local_2a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 0x11:
switchD_0012517d_caseD_11:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (os,(uint)*local_2a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 0x12:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 0x13:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    case 0x15:
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      local_1e8[0] = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,1);
      break;
    default:
      if (CONCAT22(local_268.field_2._M_allocated_capacity._2_2_,
                   local_268.field_2._M_allocated_capacity._0_2_) == 0x21)
      goto switchD_0012517d_caseD_11;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Read",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"() Unknown type \'",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,local_228,local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' output in binary\n",0x13);
      std::__cxx11::stringbuf::str();
      Logger::Log(2,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
          &local_288.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_))
        ;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base(local_168);
      std::ostream::write((char *)os,
                          (long)local_2a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
    uVar4 = (ulong)(*(int *)(freeaddrinfo + *(long *)(std::cout + -0x18)) != 0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Read",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"(): failed with: 0x",0x13);
    *(uint *)((long)auStack_1c0 + *(long *)(local_1d8[0] + -0x18)) =
         *(uint *)((long)auStack_1c0 + *(long *)(local_1d8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<long>((long)local_1d8);
    local_288._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_288,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
        &local_288.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
  }
  iVar6 = (int)uVar4;
  if ((double *)
      local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0]);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
LAB_001254af:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~_Rb_tree(&local_60);
  return iVar6;
}

Assistant:

int SymbolAccess::Read(const std::string& name, std::ostream& os) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;
    std::vector<uint8_t> readBuffer(entry.header.size);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(entry.header.iGroup,
                                          entry.header.iOffs,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return status;
    }

    switch (entry.header.dataType) {
    case 0x2:     //INT
        os << std::dec << letoh(*reinterpret_cast<int16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x3:     //DINT
        os << std::dec << letoh(*reinterpret_cast<int32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x4:     //REAL
        os << std::dec << letoh(*reinterpret_cast<float*>(readBuffer.data())) << '\n';
        break;

    case 0x5:     //LREAL
        os << std::dec << letoh(*reinterpret_cast<double*>(readBuffer.data())) << '\n';
        break;

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        os << std::dec << (int)readBuffer.data()[0] << '\n';
        break;

    case 0x12:     // WORD, UINT
        os << std::dec << letoh(*reinterpret_cast<uint16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x13:     // DWORD, UDINT
        os << std::dec << letoh(*reinterpret_cast<uint32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x15:     // LWORD, ULINT
        os << std::dec << letoh(*reinterpret_cast<uint64_t*>(readBuffer.data())) << '\n';
        break;

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' output in binary\n");
        os.write((const char*)readBuffer.data(), bytesRead);
        break;
    }

    return !std::cout.good();
}